

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Shape(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  FileLoc loc_00;
  FileLoc loc_01;
  ParameterDictionary parameters;
  bool bVar1;
  Transform *pTVar2;
  Transform *objectFromRender;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  InstanceDefinitionSceneEntity *pIVar3;
  vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_> *this_00;
  vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *this_01;
  ParameterDictionary *pPVar4;
  int lightIndex;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  undefined8 in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  undefined8 in_stack_fffffffffffff728;
  undefined8 in_stack_fffffffffffff730;
  undefined8 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff748 [24];
  undefined1 in_stack_fffffffffffff760 [24];
  ParameterDictionary local_850;
  ParameterDictionary local_7e8;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_718;
  AnimatedShapeSceneEntity local_6b8;
  AnimatedTransform renderFromShape;
  
  if (this->currentBlock != OptionsBlock) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_718,in_RDX);
    pPVar4 = &dict;
    ParameterDictionary::ParameterDictionary
              (pPVar4,&local_718,&(this->graphicsState).shapeAttributes,
               (this->graphicsState).colorSpace);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_718);
    if ((this->graphicsState).areaLightName._M_string_length == 0) {
      lightIndex = -1;
    }
    else {
      ParameterDictionary::ParameterDictionary(&local_7e8,&(this->graphicsState).areaLightParams);
      parameters.params.field_2._8_4_ = in_stack_fffffffffffff710;
      parameters.params._0_24_ = (this->graphicsState).areaLightLoc;
      parameters.params.field_2._12_4_ = in_stack_fffffffffffff714;
      parameters.params.field_2.fixed[2] = (ParsedParameter *)in_stack_fffffffffffff718;
      parameters.params.field_2._24_4_ = in_stack_fffffffffffff720;
      parameters.params.field_2._28_4_ = in_stack_fffffffffffff724;
      parameters.params.field_2.fixed[4] = (ParsedParameter *)in_stack_fffffffffffff728;
      parameters.params.field_2.fixed[5] = (ParsedParameter *)in_stack_fffffffffffff730;
      parameters.params.field_2.fixed[6] = (ParsedParameter *)pPVar4;
      parameters.params.field_2.fixed[7] = (ParsedParameter *)in_stack_fffffffffffff740;
      parameters.params.nAlloc = in_stack_fffffffffffff748._0_8_;
      parameters.params.nStored = in_stack_fffffffffffff748._8_8_;
      parameters.colorSpace = (RGBColorSpace *)in_stack_fffffffffffff748._16_8_;
      SceneEntity::SceneEntity
                ((SceneEntity *)&local_6b8,&(this->graphicsState).areaLightName,parameters,
                 (FileLoc)in_stack_fffffffffffff760);
      std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::
      emplace_back<pbrt::SceneEntity>(&this->areaLights,(SceneEntity *)&local_6b8);
      SceneEntity::~SceneEntity((SceneEntity *)&local_6b8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_7e8.params);
      lightIndex = (int)(((long)(this->areaLights).
                                super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->areaLights).
                               super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xa0) + -1;
    }
    bVar1 = TransformSet::IsAnimated(&(this->graphicsState).ctm);
    pIVar3 = this->currentInstance;
    if (bVar1) {
      if (pIVar3 == (InstanceDefinitionSceneEntity *)0x0) {
        this_00 = &this->animatedShapes;
      }
      else {
        if ((this->graphicsState).areaLightName._M_string_length != 0) {
          Warning((FileLoc *)&params,"Area lights not supported with object instancing");
          pIVar3 = this->currentInstance;
        }
        this_00 = &pIVar3->animatedShapes;
      }
      RenderFromObject(&renderFromShape,this);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[2] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[3] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[4] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[5] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[6] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[7] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.nAlloc = 0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.nStored = 0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p = (pointer)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name._M_string_length = 0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name.field_2._M_allocated_capacity =
           0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name.field_2._8_8_ = 0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.alloc.
      memoryResource = (memory_resource *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.ptr =
           (ParsedParameter **)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[0] =
           (ParsedParameter *)0x0;
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[1] =
           (ParsedParameter *)0x0;
      pbrt::Transform::Transform((Transform *)&local_6b8);
      pTVar2 = TransformCache::Lookup(&this->transformCache,(Transform *)&local_6b8);
      ParameterDictionary::ParameterDictionary(&local_850,&dict);
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
                (&local_6b8,name,&local_850,loc_00,&renderFromShape,pTVar2,
                 (this->graphicsState).reverseOrientation,(this->graphicsState).currentMaterialIndex
                 ,&(this->graphicsState).currentMaterialName,lightIndex,
                 &(this->graphicsState).currentInsideMedium,
                 &(this->graphicsState).currentOutsideMedium);
      std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>::
      emplace_back<pbrt::AnimatedShapeSceneEntity>(this_00,&local_6b8);
      AnimatedShapeSceneEntity::~AnimatedShapeSceneEntity(&local_6b8);
      pPVar4 = &local_850;
    }
    else {
      if (pIVar3 == (InstanceDefinitionSceneEntity *)0x0) {
        this_01 = &this->shapes;
      }
      else {
        if ((this->graphicsState).areaLightName._M_string_length != 0) {
          Warning((FileLoc *)&params,"Area lights not supported with object instancing");
          pIVar3 = this->currentInstance;
        }
        this_01 = &pIVar3->shapes;
      }
      RenderFromObject((Transform *)&local_6b8,this,0);
      pTVar2 = TransformCache::Lookup(&this->transformCache,(Transform *)&local_6b8);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p =
           *(pointer *)(pTVar2->mInv).m[0];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name._M_string_length =
           *(size_type *)((pTVar2->mInv).m[0] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name.field_2._M_allocated_capacity =
           *(undefined8 *)(pTVar2->mInv).m[1];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.name.field_2._8_8_ =
           *(undefined8 *)((pTVar2->mInv).m[1] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.alloc.
      memoryResource = *(memory_resource **)(pTVar2->mInv).m[2];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.ptr =
           *(ParsedParameter ***)((pTVar2->mInv).m[2] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[0] =
           (ParsedParameter *)*(undefined8 *)(pTVar2->mInv).m[3];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[1] =
           (ParsedParameter *)*(undefined8 *)((pTVar2->mInv).m[3] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[2] =
           (ParsedParameter *)*(undefined8 *)(pTVar2->m).m[0];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[3] =
           (ParsedParameter *)*(undefined8 *)((pTVar2->m).m[0] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[4] =
           (ParsedParameter *)*(undefined8 *)(pTVar2->m).m[1];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[5] =
           (ParsedParameter *)*(undefined8 *)((pTVar2->m).m[1] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[6] =
           (ParsedParameter *)*(undefined8 *)(pTVar2->m).m[2];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.field_2.fixed[7] =
           (ParsedParameter *)*(undefined8 *)((pTVar2->m).m[2] + 2);
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.nAlloc =
           *(size_t *)(pTVar2->m).m[3];
      local_6b8.super_TransformedSceneEntity.super_SceneEntity.parameters.params.nStored =
           *(size_t *)((pTVar2->m).m[3] + 2);
      objectFromRender = TransformCache::Lookup(&this->transformCache,(Transform *)&local_6b8);
      ParameterDictionary::ParameterDictionary
                ((ParameterDictionary *)&stack0xfffffffffffff748,&dict);
      loc_01.filename._M_str = (char *)params.ptr;
      loc_01.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_01._16_8_ = params.field_2.fixed[0];
      ShapeSceneEntity::ShapeSceneEntity
                ((ShapeSceneEntity *)&local_6b8,name,(ParameterDictionary *)&stack0xfffffffffffff748
                 ,loc_01,pTVar2,objectFromRender,(this->graphicsState).reverseOrientation,
                 (this->graphicsState).currentMaterialIndex,
                 &(this->graphicsState).currentMaterialName,lightIndex,
                 &(this->graphicsState).currentInsideMedium,
                 &(this->graphicsState).currentOutsideMedium);
      std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::
      emplace_back<pbrt::ShapeSceneEntity>(this_01,(ShapeSceneEntity *)&local_6b8);
      ShapeSceneEntity::~ShapeSceneEntity((ShapeSceneEntity *)&local_6b8);
      pPVar4 = (ParameterDictionary *)&stack0xfffffffffffff748;
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&pPVar4->params);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&dict.params);
    return;
  }
  ErrorExit<char_const(&)[6]>
            ((FileLoc *)&params,
             "Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [6])"Shape");
}

Assistant:

void ParsedScene::Shape(const std::string &name, ParsedParameterVector params,
                        FileLoc loc) {
    VERIFY_WORLD("Shape");

    ParameterDictionary dict(std::move(params), graphicsState.shapeAttributes,
                             graphicsState.colorSpace);

    int areaLightIndex = -1;
    if (!graphicsState.areaLightName.empty()) {
        areaLights.push_back(SceneEntity(graphicsState.areaLightName,
                                         graphicsState.areaLightParams,
                                         graphicsState.areaLightLoc));
        areaLightIndex = areaLights.size() - 1;
    }

    if (CTMIsAnimated()) {
        std::vector<AnimatedShapeSceneEntity> *as = &animatedShapes;
        if (currentInstance != nullptr) {
            if (!graphicsState.areaLightName.empty())
                Warning(&loc, "Area lights not supported with object instancing");
            as = &currentInstance->animatedShapes;
        }

        AnimatedTransform renderFromShape = RenderFromObject();
        const class Transform *identity = transformCache.Lookup(pbrt::Transform());

        as->push_back(AnimatedShapeSceneEntity(
            {name, std::move(dict), loc, renderFromShape, identity,
             graphicsState.reverseOrientation, graphicsState.currentMaterialIndex,
             graphicsState.currentMaterialName, areaLightIndex,
             graphicsState.currentInsideMedium, graphicsState.currentOutsideMedium}));
    } else {
        std::vector<ShapeSceneEntity> *s = &shapes;
        if (currentInstance != nullptr) {
            if (!graphicsState.areaLightName.empty())
                Warning(&loc, "Area lights not supported with object instancing");
            s = &currentInstance->shapes;
        }

        const class Transform *renderFromObject =
            transformCache.Lookup(RenderFromObject(0));
        const class Transform *objectFromRender =
            transformCache.Lookup(Inverse(*renderFromObject));

        s->push_back(ShapeSceneEntity(
            {name, std::move(dict), loc, renderFromObject, objectFromRender,
             graphicsState.reverseOrientation, graphicsState.currentMaterialIndex,
             graphicsState.currentMaterialName, areaLightIndex,
             graphicsState.currentInsideMedium, graphicsState.currentOutsideMedium}));
    }
}